

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<std::pair<QString,_int>_>::copyAppend
          (QGenericArrayOps<std::pair<QString,_int>_> *this,pair<QString,_int> *b,
          pair<QString,_int> *e)

{
  pair<QString,_int> *ppVar1;
  Data *pDVar2;
  long lVar3;
  long lVar4;
  
  if ((b != e) && (b < e)) {
    ppVar1 = (this->super_QArrayDataPointer<std::pair<QString,_int>_>).ptr;
    lVar4 = (this->super_QArrayDataPointer<std::pair<QString,_int>_>).size;
    do {
      pDVar2 = (b->first).d.d;
      ppVar1[lVar4].first.d.d = pDVar2;
      ppVar1[lVar4].first.d.ptr = (b->first).d.ptr;
      ppVar1[lVar4].first.d.size = (b->first).d.size;
      lVar3 = lVar4;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type_conflict)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>
             + 1);
        UNLOCK();
        lVar3 = (this->super_QArrayDataPointer<std::pair<QString,_int>_>).size;
      }
      ppVar1[lVar4].second = b->second;
      b = b + 1;
      lVar4 = lVar3 + 1;
      (this->super_QArrayDataPointer<std::pair<QString,_int>_>).size = lVar4;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }